

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianEdgeCalculator.cpp
# Opt level: O0

double __thiscall GaussianEdgeCalculator::sf(GaussianEdgeCalculator *this,double x)

{
  ulong uVar1;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  size_t i_1;
  size_t i;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_8;
  
  if (in_XMM0_Qa < 0.0) {
    dVar2 = ceil(in_XMM0_Qa / -0.001);
    uVar1 = (long)dVar2 | (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f;
    if (uVar1 < 0x9664) {
      local_40 = 1.0 - *(double *)(*(long *)(in_RDI + 0x28) + uVar1 * 8);
    }
    else {
      local_40 = 1.0;
    }
    local_8 = local_40;
  }
  else {
    dVar2 = floor(in_XMM0_Qa / 0.001);
    uVar1 = (long)dVar2 | (long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f;
    if (uVar1 < 0x9664) {
      local_38 = *(double *)(*(long *)(in_RDI + 0x28) + uVar1 * 8);
    }
    else {
      local_38 = 0.0;
    }
    local_8 = local_38;
  }
  return local_8;
}

Assistant:

double GaussianEdgeCalculator::sf(double x) const {
	if (x>=0.0) {
		size_t i = (size_t)floor(x/SF_CACHE_FACTOR);
		return (i<SF_CACHE_SIZE)?cached_survival_function[i]:0.0;
	} else {
		size_t i = (size_t)ceil(-x/SF_CACHE_FACTOR);
		return (i<SF_CACHE_SIZE)?(1.0-cached_survival_function[i]):1.0;
	}
}